

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,State *aState)

{
  uint32_t aConnMode;
  uint32_t aIfStatus;
  uint32_t aAvailability;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Interpreter *local_18;
  State *aState_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  aState_local = (State *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::to_string
            (&local_c0,
             *(ushort *)
              &(local_18->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start & 7);
  std::operator+(&local_a0,"State.ConnectionMode=",&local_c0);
  std::operator+(&local_80,&local_a0,"(");
  BaConnModeToString_abi_cxx11_
            (&local_f0,
             (Interpreter *)
             (ulong)(*(ushort *)
                      &(local_18->mContext).mNwkAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start & 7),aConnMode);
  std::operator+(&local_60,&local_80,&local_f0);
  std::operator+(&local_40,&local_60,")\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::to_string
            (&local_190,
             *(ushort *)
              &(local_18->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3 & 3);
  std::operator+(&local_170,"State.ThreadIfStatus=",&local_190);
  std::operator+(&local_150,&local_170,"(");
  BaThreadIfStatusToString_abi_cxx11_
            (&local_1b0,
             (Interpreter *)
             (ulong)(*(ushort *)
                      &(local_18->mContext).mNwkAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3 & 3),aIfStatus);
  std::operator+(&local_130,&local_150,&local_1b0);
  std::operator+(&local_110,&local_130,")\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::to_string
            (&local_250,
             *(ushort *)
              &(local_18->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5 & 3);
  std::operator+(&local_230,"State.Availability=",&local_250);
  std::operator+(&local_210,&local_230,"(");
  BaAvailabilityToString_abi_cxx11_
            (&local_270,
             (Interpreter *)
             (ulong)(*(ushort *)
                      &(local_18->mContext).mNwkAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5 & 3),aAvailability);
  std::operator+(&local_1f0,&local_210,&local_270);
  std::operator+(&local_1d0,&local_1f0,")\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::to_string
            (&local_2d0,
             *(ushort *)
              &(local_18->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 7 & 1);
  std::operator+(&local_2b0,"State.BbrIsActive=",&local_2d0);
  std::operator+(&local_290,&local_2b0,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::to_string
            (&local_310,
             *(ushort *)
              &(local_18->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 8 & 1);
  std::operator+(&local_2f0,"State.BbrIsPrimary=",&local_310);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const BorderAgent::State &aState)
{
    std::string ret;
    ret += "State.ConnectionMode=" + std::to_string(aState.mConnectionMode) + "(" +
           BaConnModeToString(aState.mConnectionMode) + ")\n";
    ret += "State.ThreadIfStatus=" + std::to_string(aState.mThreadIfStatus) + "(" +
           BaThreadIfStatusToString(aState.mThreadIfStatus) + ")\n";
    ret += "State.Availability=" + std::to_string(aState.mAvailability) + "(" +
           BaAvailabilityToString(aState.mAvailability) + ")\n";
    ret += "State.BbrIsActive=" + std::to_string(aState.mBbrIsActive) + "\n";
    ret += "State.BbrIsPrimary=" + std::to_string(aState.mBbrIsPrimary);
    return ret;
}